

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

size_t portability_path_get_relative
                 (char *base,size_t base_size,char *path,size_t path_size,char *relative,
                 size_t relative_size)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  char cVar4;
  
  if (relative != (char *)0x0 && (path != (char *)0x0 && base != (char *)0x0)) {
    if (base_size < path_size) {
      path_size = base_size;
    }
    uVar2 = 0;
    while( true ) {
      cVar1 = base[uVar2];
      cVar4 = path[uVar2];
      if (((cVar1 != path[uVar2]) || (cVar4 = cVar1, path_size <= uVar2)) || (cVar1 == '\0')) break;
      uVar2 = uVar2 + 1;
    }
    sVar3 = 1;
    for (uVar2 = (cVar4 == '/') + uVar2; (uVar2 < relative_size && (path[uVar2] != '\0'));
        uVar2 = uVar2 + 1) {
      relative[sVar3 - 1] = path[uVar2];
      sVar3 = sVar3 + 1;
    }
    relative[sVar3 - 1] = '\0';
    return sVar3;
  }
  return 0;
}

Assistant:

size_t portability_path_get_relative(const char *base, size_t base_size, const char *path, size_t path_size, char *relative, size_t relative_size)
{
	if (base == NULL || path == NULL || relative == NULL)
	{
		return 0;
	}

	size_t i, length = 0, size = base_size < path_size ? base_size : path_size;

	for (i = 0; base[i] == path[i] && (base[i] != '\0' || path[i] != '\0') && i < size; ++i)
		;

	if (PORTABILITY_PATH_SEPARATOR(path[i]))
	{
		++i;
	}

	for (; path[i] != '\0' && i < relative_size; ++i)
	{
		relative[length++] = path[i];
	}

	relative[length] = '\0';

	return length + 1;
}